

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

string * __thiscall
CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getFullParamName(string *__return_storage_ptr__,
                CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_70,"-",(allocator *)&local_50);
  std::operator+(__return_storage_ptr__,&local_70,&this->parameter_name);
  std::__cxx11::string::~string((string *)&local_70);
  if ('\n' < this->parameter_name_short) {
    getShortParamNameStr(&local_30,this);
    std::operator+(&local_50,&local_30,", -");
    std::operator+(&local_70,&local_50,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFullParamName()
    {
        std::string fullname = std::string("-")+parameter_name ;
        if (parameter_name_short > 10) {
            fullname = getShortParamNameStr()+", -"+fullname ;
        }
        return fullname ;
    }